

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

SampledSpectrum __thiscall pbrt::Vertex::f(Vertex *this,Vertex *next,TransportMode mode)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Vector3f wiRender;
  SampledSpectrum SVar11;
  
  auVar7 = vinsertps_avx(*(undefined1 (*) [16])&next->field_2,
                         ZEXT416((uint)(next->field_2).ei.super_Interaction.pi.
                                       super_Point3<pbrt::Interval<float>_>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high),
                         0x10);
  auVar3 = vinsertps_avx(*(undefined1 (*) [16])&this->field_2,
                         ZEXT416((uint)(this->field_2).ei.super_Interaction.pi.
                                       super_Point3<pbrt::Interval<float>_>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high),
                         0x10);
  fVar5 = ((next->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
          (next->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5 -
          ((this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
          (this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
  uVar1 = *(undefined8 *)
           &(next->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  uVar2 = *(undefined8 *)
           &(this->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar6._0_4_ = ((float)uVar1 + auVar7._0_4_) * 0.5;
  auVar6._4_4_ = ((float)((ulong)uVar1 >> 0x20) + auVar7._4_4_) * 0.5;
  auVar6._8_4_ = (auVar7._8_4_ + 0.0) * 0.5;
  auVar6._12_4_ = (auVar7._12_4_ + 0.0) * 0.5;
  auVar8._0_4_ = ((float)uVar2 + auVar3._0_4_) * 0.5;
  auVar8._4_4_ = ((float)((ulong)uVar2 >> 0x20) + auVar3._4_4_) * 0.5;
  auVar8._8_4_ = (auVar3._8_4_ + 0.0) * 0.5;
  auVar8._12_4_ = (auVar3._12_4_ + 0.0) * 0.5;
  auVar3 = vsubps_avx(auVar6,auVar8);
  auVar7._0_4_ = auVar3._0_4_ * auVar3._0_4_;
  auVar7._4_4_ = auVar3._4_4_ * auVar3._4_4_;
  auVar7._8_4_ = auVar3._8_4_ * auVar3._8_4_;
  auVar7._12_4_ = auVar3._12_4_ * auVar3._12_4_;
  auVar7 = vmovshdup_avx(auVar7);
  auVar7 = vfmadd231ss_fma(auVar7,auVar3,auVar3);
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
  SVar11.values.values = (array<float,_4>)(ZEXT816(0) << 0x40);
  if ((auVar7._0_4_ != 0.0) || (NAN(auVar7._0_4_))) {
    auVar7 = vsqrtss_avx(auVar7,auVar7);
    fVar4 = auVar7._0_4_;
    auVar9._4_4_ = fVar4;
    auVar9._0_4_ = fVar4;
    auVar9._8_4_ = fVar4;
    auVar9._12_4_ = fVar4;
    auVar10._0_4_ = fVar5 / fVar4;
    auVar10._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar7 = vdivps_avx(auVar3,auVar9);
    if (this->type == Medium) {
      auVar3 = vmovshdup_avx(auVar7);
      auVar7 = vfmadd132ss_fma(auVar7,ZEXT416((uint)(auVar3._0_4_ *
                                                    (this->field_2).ei.super_Interaction.wo.
                                                    super_Tuple3<pbrt::Vector3,_float>.y)),
                               ZEXT416((uint)(this->field_2).ei.super_Interaction.wo.
                                             super_Tuple3<pbrt::Vector3,_float>.x));
      fVar5 = *(float *)((ulong)(this->field_2).ei.field_0 & 0xffffffffffff);
      auVar7 = vfmadd132ss_fma(auVar10,auVar7,
                               ZEXT416((uint)(this->field_2).ei.super_Interaction.wo.
                                             super_Tuple3<pbrt::Vector3,_float>.z));
      auVar6 = vfnmadd213ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),
                                SUB6416(ZEXT464(0x3f800000),0));
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)fVar5),
                               SUB6416(ZEXT464(0x3f800000),0));
      auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)(fVar5 + fVar5)),auVar7);
      auVar7 = vmaxss_avx(auVar3,ZEXT816(0));
      auVar7 = vsqrtss_avx(auVar7,auVar7);
      fVar5 = (auVar6._0_4_ * 0.07957747) / (auVar3._0_4_ * auVar7._0_4_);
      SVar11.values.values[2] = fVar5;
      SVar11.values.values[3] = fVar5;
      SVar11.values.values[0] = fVar5;
      SVar11.values.values[1] = fVar5;
    }
    else {
      if (this->type != Surface) {
        LogFatal(Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
                 ,0x667,"Vertex::f(): Unimplemented");
      }
      wiRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar7._0_8_;
      wiRender.super_Tuple3<pbrt::Vector3,_float>.z = auVar10._0_4_;
      SVar11 = BSDF::f(&this->bsdf,
                       (Vector3f)*(Tuple3<pbrt::Vector3,_float> *)((long)&this->field_2 + 0x1c),
                       wiRender,mode);
    }
  }
  return (array<float,_4>)(array<float,_4>)SVar11;
}

Assistant:

SampledSpectrum f(const Vertex &next, TransportMode mode) const {
        Vector3f wi = next.p() - p();
        if (LengthSquared(wi) == 0)
            return {};
        wi = Normalize(wi);
        switch (type) {
        case VertexType::Surface:
            return bsdf.f(si.wo, wi, mode);
        case VertexType::Medium:
            return SampledSpectrum(mi.phase.p(mi.wo, wi));
        default:
            LOG_FATAL("Vertex::f(): Unimplemented");
            return SampledSpectrum(0.f);
        }
    }